

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall aeron::ClientConductor::closeAllResources(ClientConductor *this,longlong now)

{
  pointer pPVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer pEVar4;
  element_type *peVar5;
  pointer pSVar6;
  Subscription *this_00;
  int iVar7;
  _Atomic_word _Var8;
  ImageList *imageList;
  pointer __pos;
  pointer __pos_00;
  pointer pSVar9;
  pointer this_01;
  bool bVar10;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  (this->m_isClosed)._M_base._M_i = true;
  __pos = (this->m_publications).
          super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->m_publications).
           super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__pos != pPVar1) {
    do {
      p_Var2 = (__pos->m_publication).
               super___weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var8 = p_Var2->_M_use_count;
        do {
          if (_Var8 == 0) goto LAB_00141eee;
          LOCK();
          iVar7 = p_Var2->_M_use_count;
          bVar10 = _Var8 == iVar7;
          if (bVar10) {
            p_Var2->_M_use_count = _Var8 + 1;
            iVar7 = _Var8;
          }
          _Var8 = iVar7;
          UNLOCK();
        } while (!bVar10);
        if ((p_Var2->_M_use_count != 0) &&
           (peVar3 = (__pos->m_publication).
                     super___weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           peVar3 != (element_type *)0x0)) {
          (peVar3->m_isClosed)._M_base._M_i = true;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
LAB_00141eee:
      __pos = __pos + 1;
    } while (__pos != pPVar1);
    __pos = (this->m_publications).
            super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  ::_M_erase_at_end(&this->m_publications,__pos);
  __pos_00 = (this->m_exclusivePublications).
             super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__pos_00 != pEVar4) {
    do {
      p_Var2 = (__pos_00->m_publication).
               super___weak_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var8 = p_Var2->_M_use_count;
        do {
          if (_Var8 == 0) goto LAB_00141f56;
          LOCK();
          iVar7 = p_Var2->_M_use_count;
          bVar10 = _Var8 == iVar7;
          if (bVar10) {
            p_Var2->_M_use_count = _Var8 + 1;
            iVar7 = _Var8;
          }
          _Var8 = iVar7;
          UNLOCK();
        } while (!bVar10);
        if ((p_Var2->_M_use_count != 0) &&
           (peVar5 = (__pos_00->m_publication).
                     super___weak_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr, peVar5 != (element_type *)0x0)) {
          (peVar5->m_isClosed)._M_base._M_i = true;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
LAB_00141f56:
      __pos_00 = __pos_00 + 1;
    } while (__pos_00 != pEVar4);
    __pos_00 = (this->m_exclusivePublications).
               super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
  ::_M_erase_at_end(&this->m_exclusivePublications,__pos_00);
  pSVar9 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar9 != pSVar6) {
    do {
      p_Var2 = (pSVar9->m_subscription).
               super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var8 = p_Var2->_M_use_count;
        do {
          if (_Var8 == 0) goto LAB_00141fc9;
          LOCK();
          iVar7 = p_Var2->_M_use_count;
          bVar10 = _Var8 == iVar7;
          if (bVar10) {
            p_Var2->_M_use_count = _Var8 + 1;
            iVar7 = _Var8;
          }
          _Var8 = iVar7;
          UNLOCK();
        } while (!bVar10);
        if ((p_Var2->_M_use_count != 0) &&
           (this_00 = (pSVar9->m_subscription).
                      super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           this_00 != (Subscription *)0x0)) {
          imageList = Subscription::removeAndCloseAllImages(this_00);
          lingerAllResources(this,now,imageList);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
LAB_00141fc9:
      pSVar9 = pSVar9 + 1;
    } while (pSVar9 != pSVar6);
    pSVar9 = (this->m_subscriptions).
             super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = (this->m_subscriptions).
             super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_01 = pSVar9;
    if (pSVar6 != pSVar9) {
      do {
        SubscriptionStateDefn::~SubscriptionStateDefn(this_01);
        this_01 = this_01 + 1;
      } while (this_01 != pSVar6);
      (this->m_subscriptions).
      super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar9;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::closeAllResources(long long now)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    forceClose();

    std::for_each(m_publications.begin(), m_publications.end(),
        [&](PublicationStateDefn& entry)
        {
            std::shared_ptr<Publication> pub = entry.m_publication.lock();

            if (nullptr != pub)
            {
                pub->close();
            }
        });

    m_publications.clear();

    std::for_each(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [&](ExclusivePublicationStateDefn& entry)
        {
            std::shared_ptr<ExclusivePublication> pub = entry.m_publication.lock();

            if (nullptr != pub)
            {
                pub->close();
            }
        });

    m_exclusivePublications.clear();

    std::for_each(m_subscriptions.begin(), m_subscriptions.end(),
        [&](SubscriptionStateDefn& entry)
        {
            std::shared_ptr<Subscription> sub = entry.m_subscription.lock();

            if (nullptr != sub)
            {
                lingerAllResources(now, sub->removeAndCloseAllImages());
            }
        });

    m_subscriptions.clear();
}